

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O3

string * __thiscall
cmRulePlaceholderExpander::ExpandVariable
          (string *__return_storage_ptr__,cmRulePlaceholderExpander *this,string *variable)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmOutputConverter *pcVar2;
  int iVar3;
  iterator iVar4;
  long *plVar5;
  size_t sVar6;
  string *psVar7;
  long lVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  RuleVariables *pRVar15;
  size_type *psVar16;
  char *pcVar17;
  _Base_ptr p_Var18;
  char *pcVar19;
  pointer pcVar20;
  _Base_ptr __rhs;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view source;
  string_view str;
  string_view str_00;
  string local_b8;
  string sysroot;
  
  pRVar15 = this->ReplaceValues;
  if (pRVar15->LinkFlags != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->LinkFlags;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Linker != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar2 = this->OutputConverter;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sysroot,pRVar15->Linker,(allocator<char> *)&local_b8);
      cmOutputConverter::ConvertToOutputForExisting
                (__return_storage_ptr__,pcVar2,&sysroot,SHELL,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sysroot._M_dataplus._M_p != &sysroot.field_2) {
        operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
      }
      pcVar19 = this->ReplaceValues->Launcher;
      if (pcVar19 == (char *)0x0) {
        return __return_storage_ptr__;
      }
      sysroot._M_dataplus._M_p = (pointer)strlen(pcVar19);
      sysroot.field_2._M_allocated_capacity = 0;
      sysroot.field_2._8_8_ = 1;
      views._M_len = 3;
      views._M_array = (iterator)&sysroot;
      sysroot._M_string_length = (size_type)pcVar19;
      cmCatViews(&local_b8,views);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0036ba3b;
    }
  }
  if (pRVar15->Manifests != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->Manifests;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Flags != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->Flags;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Source != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->Source;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->DynDepFile != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->DynDepFile;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->PreprocessedSource != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->PreprocessedSource;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->AssemblySource != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->AssemblySource;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Object != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->Object;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->ObjectDir != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->ObjectDir;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->ObjectFileDir != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->ObjectFileDir;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Objects != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->Objects;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->ObjectsQuoted != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->ObjectsQuoted;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->CudaCompileMode != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->CudaCompileMode;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->AIXExports != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->AIXExports;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->ISPCHeader != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->ISPCHeader;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Defines != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->Defines;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Includes != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->Includes;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->SwiftLibraryName != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->SwiftLibraryName;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->SwiftModule != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->SwiftModule;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->SwiftModuleName != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->SwiftModuleName;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->SwiftSources != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->SwiftSources;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->TargetPDB != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->TargetPDB;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->TargetCompilePDB != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->TargetCompilePDB;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->DependencyFile != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->DependencyFile;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->DependencyTarget != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->DependencyTarget;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Fatbinary != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->Fatbinary;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->RegisterFile != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->RegisterFile;
      goto LAB_0036bb36;
    }
  }
  if (pRVar15->Target == (char *)0x0) {
LAB_0036b7c7:
    iVar3 = std::__cxx11::string::compare((char *)variable);
    if ((iVar3 == 0) ||
       ((iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0 ||
        (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)))) {
      if (this->ReplaceValues->TargetSOName != (char *)0x0) {
        iVar3 = std::__cxx11::string::compare((char *)variable);
        if (iVar3 == 0) {
          pcVar19 = this->ReplaceValues->TargetSOName;
LAB_0036bb36:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,pcVar19,(allocator<char> *)&sysroot);
          return __return_storage_ptr__;
        }
        iVar3 = std::__cxx11::string::compare((char *)variable);
        if ((iVar3 == 0) && (pcVar19 = this->ReplaceValues->SONameFlag, pcVar19 != (char *)0x0)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar6 = strlen(pcVar19);
          pcVar17 = pcVar19 + sVar6;
          goto LAB_0036bbd3;
        }
        if ((this->ReplaceValues->TargetInstallNameDir != (char *)0x0) &&
           (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
          pcVar19 = this->ReplaceValues->TargetInstallNameDir;
          goto LAB_0036bb36;
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar17 = "";
      pcVar19 = "";
      goto LAB_0036bbd3;
    }
    pRVar15 = this->ReplaceValues;
    if (pRVar15->LinkLibraries != (char *)0x0) {
      iVar3 = std::__cxx11::string::compare((char *)variable);
      pRVar15 = this->ReplaceValues;
      if (iVar3 == 0) {
        pcVar19 = pRVar15->LinkLibraries;
        goto LAB_0036bb36;
      }
    }
    if (pRVar15->Language != (char *)0x0) {
      iVar3 = std::__cxx11::string::compare((char *)variable);
      pRVar15 = this->ReplaceValues;
      if (iVar3 == 0) {
        pcVar19 = pRVar15->Language;
        goto LAB_0036bb36;
      }
    }
    if (pRVar15->CMTargetName != (char *)0x0) {
      iVar3 = std::__cxx11::string::compare((char *)variable);
      pRVar15 = this->ReplaceValues;
      if (iVar3 == 0) {
        pcVar19 = pRVar15->CMTargetName;
        goto LAB_0036bb36;
      }
    }
    if (pRVar15->CMTargetType != (char *)0x0) {
      iVar3 = std::__cxx11::string::compare((char *)variable);
      pRVar15 = this->ReplaceValues;
      if (iVar3 == 0) {
        pcVar19 = pRVar15->CMTargetType;
        goto LAB_0036bb36;
      }
    }
    if ((pRVar15->Output != (char *)0x0) &&
       (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
      pcVar19 = this->ReplaceValues->Output;
      goto LAB_0036bb36;
    }
    iVar3 = std::__cxx11::string::compare((char *)variable);
    if (iVar3 == 0) {
      pcVar2 = this->OutputConverter;
      psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      source._M_str = (psVar7->_M_dataplus)._M_p;
      source._M_len = psVar7->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (__return_storage_ptr__,pcVar2,source,SHELL,false);
      return __return_storage_ptr__;
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->Compilers)._M_t,variable);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->Compilers)._M_t._M_impl.super__Rb_tree_header) {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->VariableMappings)._M_t,variable);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar20 = (variable->_M_dataplus)._M_p;
        p_Var18 = (_Base_ptr)variable->_M_string_length;
      }
      else {
        lVar8 = std::__cxx11::string::find((char *)variable,0x946f09,0);
        if (lVar8 == -1) {
          cmOutputConverter::ConvertToOutputForExisting
                    (__return_storage_ptr__,this->OutputConverter,(string *)(iVar4._M_node + 2),
                     SHELL,false);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar20 = *(pointer *)(iVar4._M_node + 2);
        p_Var18 = iVar4._M_node[2]._M_parent;
      }
LAB_0036bcdf:
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar20,
                 (pointer)((long)&p_Var18->_M_color + (long)pcVar20));
      return __return_storage_ptr__;
    }
    pcVar2 = this->OutputConverter;
    __rhs = iVar4._M_node + 2;
    std::operator+(&local_b8,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    this_00 = &this->VariableMappings;
    paVar1 = &sysroot.field_2;
    psVar16 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar16) {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot.field_2._8_8_ = plVar5[3];
      sysroot._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot._M_dataplus._M_p = (pointer)*plVar5;
    }
    sysroot._M_string_length = plVar5[1];
    *plVar5 = (long)psVar16;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&sysroot);
    cmOutputConverter::ConvertToOutputForExisting(__return_storage_ptr__,pcVar2,pmVar9,SHELL,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p != paVar1) {
      operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b8,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar16) {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot.field_2._8_8_ = plVar5[3];
      sysroot._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot._M_dataplus._M_p = (pointer)*plVar5;
    }
    sysroot._M_string_length = plVar5[1];
    *plVar5 = (long)psVar16;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&sysroot);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p != paVar1) {
      operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b8,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar16) {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot.field_2._8_8_ = plVar5[3];
      sysroot._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot._M_dataplus._M_p = (pointer)*plVar5;
    }
    sysroot._M_string_length = plVar5[1];
    *plVar5 = (long)psVar16;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&sysroot);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p != paVar1) {
      operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b8,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar16) {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot.field_2._8_8_ = plVar5[3];
      sysroot._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot._M_dataplus._M_p = (pointer)*plVar5;
    }
    sysroot._M_string_length = plVar5[1];
    *plVar5 = (long)psVar16;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&sysroot);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p != paVar1) {
      operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b8,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar16) {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot.field_2._8_8_ = plVar5[3];
      sysroot._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot._M_dataplus._M_p = (pointer)*plVar5;
    }
    sysroot._M_string_length = plVar5[1];
    *plVar5 = (long)psVar16;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&sysroot);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p != paVar1) {
      operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b8,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar16) {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot.field_2._8_8_ = plVar5[3];
      sysroot._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot._M_dataplus._M_p = (pointer)*plVar5;
    }
    sysroot._M_string_length = plVar5[1];
    *plVar5 = (long)psVar16;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&sysroot);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p != paVar1) {
      operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b8,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar16) {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot.field_2._8_8_ = plVar5[3];
      sysroot._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      sysroot.field_2._M_allocated_capacity = *psVar16;
      sysroot._M_dataplus._M_p = (pointer)*plVar5;
    }
    sysroot._M_string_length = plVar5[1];
    *plVar5 = (long)psVar16;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&sysroot);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p != paVar1) {
      operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)__rhs);
    if ((iVar3 == 0) && (this->ReplaceValues->Launcher != (char *)0x0)) {
      cmStrCat<char_const*const&,char_const(&)[2],std::__cxx11::string&>
                (&sysroot,&this->ReplaceValues->Launcher,(char (*) [2])0x90c5e0,
                 __return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sysroot);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sysroot._M_dataplus._M_p != paVar1) {
        operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
      }
    }
    if (pmVar9->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pmVar9->_M_dataplus)._M_p);
    }
    if ((pmVar10->_M_string_length != 0) && (pmVar11->_M_string_length != 0)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pmVar11->_M_dataplus)._M_p);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pmVar10->_M_dataplus)._M_p);
    }
    if ((pmVar12->_M_string_length != 0) && (pmVar13->_M_string_length != 0)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pmVar13->_M_dataplus)._M_p);
      str._M_str = (pmVar12->_M_dataplus)._M_p;
      str._M_len = pmVar12->_M_string_length;
      cmOutputConverter::EscapeForShell_abi_cxx11_
                (&sysroot,this->OutputConverter,str,true,false,false,false,false);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)sysroot._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sysroot._M_dataplus._M_p != paVar1) {
        operator_delete(sysroot._M_dataplus._M_p,sysroot.field_2._M_allocated_capacity + 1);
      }
    }
    sysroot._M_string_length = 0;
    sysroot.field_2._M_allocated_capacity =
         sysroot.field_2._M_allocated_capacity & 0xffffffffffffff00;
    sysroot._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&sysroot);
    if ((sysroot._M_string_length != 0) && (pmVar14->_M_string_length != 0)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pmVar14->_M_dataplus)._M_p);
      str_00._M_str = sysroot._M_dataplus._M_p;
      str_00._M_len = sysroot._M_string_length;
      cmOutputConverter::EscapeForShell_abi_cxx11_
                (&local_b8,this->OutputConverter,str_00,true,false,false,false,false);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    local_b8.field_2._M_allocated_capacity = sysroot.field_2._M_allocated_capacity;
    local_b8._M_dataplus._M_p = sysroot._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
    goto LAB_0036ba3b;
  }
  iVar3 = std::__cxx11::string::compare((char *)variable);
  if (iVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,this->ReplaceValues->Target,
               (allocator<char> *)&sysroot);
    if (__return_storage_ptr__->_M_string_length == 0) {
      return __return_storage_ptr__;
    }
    if (*(__return_storage_ptr__->_M_dataplus)._M_p == '\"') {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar3 = std::__cxx11::string::compare((char *)variable);
  pRVar15 = this->ReplaceValues;
  if (iVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pRVar15->Target,(allocator<char> *)&sysroot);
    if (__return_storage_ptr__->_M_string_length < 3) {
      return __return_storage_ptr__;
    }
    pcVar19 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (*pcVar19 != '\"') {
      return __return_storage_ptr__;
    }
    if (pcVar19[__return_storage_ptr__->_M_string_length - 1] != '\"') {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&sysroot,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sysroot);
LAB_0036be28:
    local_b8.field_2._M_allocated_capacity = sysroot.field_2._M_allocated_capacity;
    local_b8._M_dataplus._M_p = sysroot._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p == &sysroot.field_2) {
      return __return_storage_ptr__;
    }
LAB_0036ba3b:
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  if (pRVar15->LanguageCompileFlags != (char *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    pRVar15 = this->ReplaceValues;
    if (iVar3 == 0) {
      pcVar19 = pRVar15->LanguageCompileFlags;
      goto LAB_0036bb36;
    }
  }
  if ((pRVar15->Target != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar19 = this->ReplaceValues->Target;
    goto LAB_0036bb36;
  }
  iVar3 = std::__cxx11::string::compare((char *)variable);
  if (iVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar20 = (this->TargetImpLib)._M_dataplus._M_p;
    p_Var18 = (_Base_ptr)(this->TargetImpLib)._M_string_length;
    goto LAB_0036bcdf;
  }
  iVar3 = std::__cxx11::string::compare((char *)variable);
  if (iVar3 == 0) {
    pcVar19 = this->ReplaceValues->TargetVersionMajor;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)variable);
    if (iVar3 != 0) {
      if ((this->ReplaceValues->Target == (char *)0x0) ||
         (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 != 0)) goto LAB_0036b7c7;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sysroot,this->ReplaceValues->Target,(allocator<char> *)&local_b8);
      lVar8 = std::__cxx11::string::rfind((char)&sysroot,0x2e);
      if (lVar8 == -1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sysroot._M_dataplus._M_p == &sysroot.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               sysroot.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = sysroot.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = sysroot._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               sysroot.field_2._M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = sysroot._M_string_length;
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&sysroot);
      goto LAB_0036be28;
    }
    pcVar19 = this->ReplaceValues->TargetVersionMinor;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  if (pcVar19 == (char *)0x0) {
    pcVar19 = "0";
    pcVar17 = "";
  }
  else {
    sVar6 = strlen(pcVar19);
    pcVar17 = pcVar19 + sVar6;
  }
LAB_0036bbd3:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar19,pcVar17);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRulePlaceholderExpander::ExpandVariable(
  std::string const& variable)
{
  if (this->ReplaceValues->LinkFlags) {
    if (variable == "LINK_FLAGS") {
      return this->ReplaceValues->LinkFlags;
    }
  }
  if (this->ReplaceValues->Linker) {
    if (variable == "CMAKE_LINKER") {
      auto result = this->OutputConverter->ConvertToOutputForExisting(
        this->ReplaceValues->Linker);
      if (this->ReplaceValues->Launcher) {
        // Add launcher as part of expansion so that it always appears
        // immediately before the command itself, regardless of whether the
        // overall rule template contains other content at the front.
        result = cmStrCat(this->ReplaceValues->Launcher, " ", result);
      }
      return result;
    }
  }
  if (this->ReplaceValues->Manifests) {
    if (variable == "MANIFESTS") {
      return this->ReplaceValues->Manifests;
    }
  }
  if (this->ReplaceValues->Flags) {
    if (variable == "FLAGS") {
      return this->ReplaceValues->Flags;
    }
  }

  if (this->ReplaceValues->Source) {
    if (variable == "SOURCE") {
      return this->ReplaceValues->Source;
    }
  }
  if (this->ReplaceValues->DynDepFile) {
    if (variable == "DYNDEP_FILE") {
      return this->ReplaceValues->DynDepFile;
    }
  }
  if (this->ReplaceValues->PreprocessedSource) {
    if (variable == "PREPROCESSED_SOURCE") {
      return this->ReplaceValues->PreprocessedSource;
    }
  }
  if (this->ReplaceValues->AssemblySource) {
    if (variable == "ASSEMBLY_SOURCE") {
      return this->ReplaceValues->AssemblySource;
    }
  }
  if (this->ReplaceValues->Object) {
    if (variable == "OBJECT") {
      return this->ReplaceValues->Object;
    }
  }
  if (this->ReplaceValues->ObjectDir) {
    if (variable == "OBJECT_DIR") {
      return this->ReplaceValues->ObjectDir;
    }
  }
  if (this->ReplaceValues->ObjectFileDir) {
    if (variable == "OBJECT_FILE_DIR") {
      return this->ReplaceValues->ObjectFileDir;
    }
  }
  if (this->ReplaceValues->Objects) {
    if (variable == "OBJECTS") {
      return this->ReplaceValues->Objects;
    }
  }
  if (this->ReplaceValues->ObjectsQuoted) {
    if (variable == "OBJECTS_QUOTED") {
      return this->ReplaceValues->ObjectsQuoted;
    }
  }
  if (this->ReplaceValues->CudaCompileMode) {
    if (variable == "CUDA_COMPILE_MODE") {
      return this->ReplaceValues->CudaCompileMode;
    }
  }
  if (this->ReplaceValues->AIXExports) {
    if (variable == "AIX_EXPORTS") {
      return this->ReplaceValues->AIXExports;
    }
  }
  if (this->ReplaceValues->ISPCHeader) {
    if (variable == "ISPC_HEADER") {
      return this->ReplaceValues->ISPCHeader;
    }
  }
  if (this->ReplaceValues->Defines && variable == "DEFINES") {
    return this->ReplaceValues->Defines;
  }
  if (this->ReplaceValues->Includes && variable == "INCLUDES") {
    return this->ReplaceValues->Includes;
  }
  if (this->ReplaceValues->SwiftLibraryName) {
    if (variable == "SWIFT_LIBRARY_NAME") {
      return this->ReplaceValues->SwiftLibraryName;
    }
  }
  if (this->ReplaceValues->SwiftModule) {
    if (variable == "SWIFT_MODULE") {
      return this->ReplaceValues->SwiftModule;
    }
  }
  if (this->ReplaceValues->SwiftModuleName) {
    if (variable == "SWIFT_MODULE_NAME") {
      return this->ReplaceValues->SwiftModuleName;
    }
  }
  if (this->ReplaceValues->SwiftSources) {
    if (variable == "SWIFT_SOURCES") {
      return this->ReplaceValues->SwiftSources;
    }
  }
  if (this->ReplaceValues->TargetPDB) {
    if (variable == "TARGET_PDB") {
      return this->ReplaceValues->TargetPDB;
    }
  }
  if (this->ReplaceValues->TargetCompilePDB) {
    if (variable == "TARGET_COMPILE_PDB") {
      return this->ReplaceValues->TargetCompilePDB;
    }
  }
  if (this->ReplaceValues->DependencyFile) {
    if (variable == "DEP_FILE") {
      return this->ReplaceValues->DependencyFile;
    }
  }
  if (this->ReplaceValues->DependencyTarget) {
    if (variable == "DEP_TARGET") {
      return this->ReplaceValues->DependencyTarget;
    }
  }
  if (this->ReplaceValues->Fatbinary) {
    if (variable == "FATBINARY") {
      return this->ReplaceValues->Fatbinary;
    }
  }
  if (this->ReplaceValues->RegisterFile) {
    if (variable == "REGISTER_FILE") {
      return this->ReplaceValues->RegisterFile;
    }
  }

  if (this->ReplaceValues->Target) {
    if (variable == "TARGET_QUOTED") {
      std::string targetQuoted = this->ReplaceValues->Target;
      if (!targetQuoted.empty() && targetQuoted.front() != '\"') {
        targetQuoted = '\"';
        targetQuoted += this->ReplaceValues->Target;
        targetQuoted += '\"';
      }
      return targetQuoted;
    }
    if (variable == "TARGET_UNQUOTED") {
      std::string unquoted = this->ReplaceValues->Target;
      std::string::size_type sz = unquoted.size();
      if (sz > 2 && unquoted.front() == '\"' && unquoted.back() == '\"') {
        unquoted = unquoted.substr(1, sz - 2);
      }
      return unquoted;
    }
    if (this->ReplaceValues->LanguageCompileFlags) {
      if (variable == "LANGUAGE_COMPILE_FLAGS") {
        return this->ReplaceValues->LanguageCompileFlags;
      }
    }
    if (this->ReplaceValues->Target) {
      if (variable == "TARGET") {
        return this->ReplaceValues->Target;
      }
    }
    if (variable == "TARGET_IMPLIB") {
      return this->TargetImpLib;
    }
    if (variable == "TARGET_VERSION_MAJOR") {
      if (this->ReplaceValues->TargetVersionMajor) {
        return this->ReplaceValues->TargetVersionMajor;
      }
      return "0";
    }
    if (variable == "TARGET_VERSION_MINOR") {
      if (this->ReplaceValues->TargetVersionMinor) {
        return this->ReplaceValues->TargetVersionMinor;
      }
      return "0";
    }
    if (this->ReplaceValues->Target) {
      if (variable == "TARGET_BASE") {
        // Strip the last extension off the target name.
        std::string targetBase = this->ReplaceValues->Target;
        std::string::size_type pos = targetBase.rfind('.');
        if (pos != std::string::npos) {
          return targetBase.substr(0, pos);
        }
        return targetBase;
      }
    }
  }
  if (variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
      variable == "TARGET_INSTALLNAME_DIR") {
    // All these variables depend on TargetSOName
    if (this->ReplaceValues->TargetSOName) {
      if (variable == "TARGET_SONAME") {
        return this->ReplaceValues->TargetSOName;
      }
      if (variable == "SONAME_FLAG" && this->ReplaceValues->SONameFlag) {
        return this->ReplaceValues->SONameFlag;
      }
      if (this->ReplaceValues->TargetInstallNameDir &&
          variable == "TARGET_INSTALLNAME_DIR") {
        return this->ReplaceValues->TargetInstallNameDir;
      }
    }
    return "";
  }
  if (this->ReplaceValues->LinkLibraries) {
    if (variable == "LINK_LIBRARIES") {
      return this->ReplaceValues->LinkLibraries;
    }
  }
  if (this->ReplaceValues->Language) {
    if (variable == "LANGUAGE") {
      return this->ReplaceValues->Language;
    }
  }
  if (this->ReplaceValues->CMTargetName) {
    if (variable == "TARGET_NAME") {
      return this->ReplaceValues->CMTargetName;
    }
  }
  if (this->ReplaceValues->CMTargetType) {
    if (variable == "TARGET_TYPE") {
      return this->ReplaceValues->CMTargetType;
    }
  }
  if (this->ReplaceValues->Output) {
    if (variable == "OUTPUT") {
      return this->ReplaceValues->Output;
    }
  }
  if (variable == "CMAKE_COMMAND") {
    return this->OutputConverter->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
  }

  auto compIt = this->Compilers.find(variable);

  if (compIt != this->Compilers.end()) {
    std::string ret = this->OutputConverter->ConvertToOutputForExisting(
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER"]);
    std::string const& compilerArg1 =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_ARG1"];
    std::string const& compilerTarget =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_TARGET"];
    std::string const& compilerOptionTarget =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_TARGET"];
    std::string const& compilerExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILER_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionSysroot =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_SYSROOT"];

    if (compIt->second == this->ReplaceValues->Language &&
        this->ReplaceValues->Launcher) {
      // Add launcher as part of expansion so that it always appears
      // immediately before the command itself, regardless of whether the
      // overall rule template contains other content at the front.
      ret = cmStrCat(this->ReplaceValues->Launcher, " ", ret);
    }

    // if there are required arguments to the compiler add it
    // to the compiler string
    if (!compilerArg1.empty()) {
      ret += " ";
      ret += compilerArg1;
    }
    if (!compilerTarget.empty() && !compilerOptionTarget.empty()) {
      ret += " ";
      ret += compilerOptionTarget;
      ret += compilerTarget;
    }
    if (!compilerExternalToolchain.empty() &&
        !compilerOptionExternalToolchain.empty()) {
      ret += " ";
      ret += compilerOptionExternalToolchain;
      ret +=
        this->OutputConverter->EscapeForShell(compilerExternalToolchain, true);
    }
    std::string sysroot;
    // Some platforms may use separate sysroots for compiling and linking.
    // If we detect link flags, then we pass the link sysroot instead.
    // FIXME: Use a more robust way to detect link line expansion.
    if (this->ReplaceValues->LinkFlags) {
      sysroot = this->LinkerSysroot;
    } else {
      sysroot = this->CompilerSysroot;
    }
    if (!sysroot.empty() && !compilerOptionSysroot.empty()) {
      ret += " ";
      ret += compilerOptionSysroot;
      ret += this->OutputConverter->EscapeForShell(sysroot, true);
    }
    return ret;
  }

  auto mapIt = this->VariableMappings.find(variable);
  if (mapIt != this->VariableMappings.end()) {
    if (variable.find("_FLAG") == std::string::npos) {
      return this->OutputConverter->ConvertToOutputForExisting(mapIt->second);
    }
    return mapIt->second;
  }
  return variable;
}